

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::DiscardTarget(SQFuncState *this)

{
  uchar uVar1;
  ulong uVar2;
  SQUnsignedInteger SVar3;
  SQInstruction *pSVar4;
  SQInstruction *pi;
  SQInteger size;
  SQInteger discardedtarget;
  SQFuncState *this_local;
  
  uVar2 = PopTarget(this);
  SVar3 = sqvector<SQInstruction>::size(&this->_instructions);
  if ((0 < (long)SVar3) && ((this->_optimization & 1U) != 0)) {
    pSVar4 = sqvector<SQInstruction>::operator[](&this->_instructions,SVar3 - 1);
    uVar1 = pSVar4->op;
    if (((uVar1 == '\x06') || (((uVar1 == '\v' || (uVar1 == '\r')) || (uVar1 == '\x1f')))) &&
       (pSVar4->_arg0 == uVar2)) {
      pSVar4->_arg0 = 0xff;
    }
  }
  return;
}

Assistant:

void SQFuncState::DiscardTarget()
{
    SQInteger discardedtarget = PopTarget();
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(pi.op) {
        case _OP_SET:case _OP_NEWSLOT:case _OP_SETOUTER:case _OP_CALL:
            if(pi._arg0 == discardedtarget) {
                pi._arg0 = 0xFF;
            }
        }
    }
}